

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts_p.h
# Opt level: O1

bool __thiscall QHstsCache::HostName::operator<(HostName *this,HostName *rhs)

{
  byte extraout_var;
  storage_type_conflict *psVar1;
  long lVar2;
  storage_type_conflict *psVar3;
  long lVar4;
  QStringView QVar5;
  QStringView QVar6;
  
  lVar4 = (this->fragment).m_size;
  lVar2 = (rhs->fragment).m_size;
  if (lVar4 == 0) {
    psVar3 = (this->name).d.ptr;
    lVar4 = (this->name).d.size;
    if (lVar2 == 0) {
      psVar1 = (rhs->name).d.ptr;
      lVar2 = (rhs->name).d.size;
    }
    else {
      psVar1 = (rhs->fragment).m_data;
    }
  }
  else if (lVar2 == 0) {
    psVar1 = (rhs->name).d.ptr;
    lVar2 = (rhs->name).d.size;
    psVar3 = (this->fragment).m_data;
  }
  else {
    psVar3 = (this->fragment).m_data;
    psVar1 = (rhs->fragment).m_data;
  }
  QVar5.m_data = psVar3;
  QVar5.m_size = lVar4;
  QVar6.m_data = psVar1;
  QVar6.m_size = lVar2;
  QtPrivate::compareStrings(QVar5,QVar6,CaseSensitive);
  return (bool)(extraout_var >> 7);
}

Assistant:

bool operator < (const HostName &rhs) const
        {
            if (fragment.size()) {
                if (rhs.fragment.size())
                    return fragment < rhs.fragment;
                return fragment < QStringView{rhs.name};
            }

            if (rhs.fragment.size())
                return QStringView{name} < rhs.fragment;
            return name < rhs.name;
        }